

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bicubic_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  long lVar19;
  __m512 *in_RDX;
  long *in_RSI;
  __m512 *coeffs0;
  long *in_RDI;
  undefined1 auVar20 [64];
  __m512 _v;
  __m512 x3_val;
  __m512 x2_val;
  __m512 x1_val;
  __m512 x0_val;
  int ii;
  int *offset_ptr;
  __m512 value_f [4];
  __m512 y_coeffs3;
  __m512 y_coeffs2;
  __m512 y_coeffs1;
  __m512 y_coeffs0;
  __m512 x_coeffs3;
  __m512 x_coeffs2;
  __m512 x_coeffs1;
  __m512 x_coeffs0;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  undefined8 local_1380;
  undefined8 uStackY_1378;
  undefined8 uStackY_1370;
  undefined8 uStackY_1368;
  undefined8 uStackY_1360;
  undefined8 uStackY_1358;
  undefined8 uStackY_1350;
  undefined8 uStackY_1348;
  undefined8 local_1340;
  undefined8 uStackY_1338;
  undefined8 uStackY_1330;
  undefined8 uStackY_1328;
  undefined8 uStackY_1320;
  undefined8 uStackY_1318;
  undefined8 uStackY_1310;
  undefined8 uStackY_1308;
  undefined8 local_1300;
  undefined8 uStackY_12f8;
  undefined8 uStackY_12f0;
  undefined8 uStackY_12e8;
  undefined8 uStackY_12e0;
  undefined8 uStackY_12d8;
  undefined8 uStackY_12d0;
  undefined8 uStackY_12c8;
  undefined8 local_12c0;
  undefined8 uStackY_12b8;
  undefined8 uStackY_12b0;
  undefined8 uStackY_12a8;
  undefined8 uStackY_12a0;
  undefined8 uStackY_1298;
  undefined8 uStackY_1290;
  undefined8 uStackY_1288;
  float *tx;
  __m512 *in_stack_ffffffffffffed98;
  __m512 *coeffs2;
  __m512 *coeffs1;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  int local_108c;
  float *local_1088;
  undefined8 local_1000 [4];
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  int local_cd0;
  float local_cc0 [8];
  float local_ca0 [2];
  float local_c98;
  float local_c94;
  float local_c90;
  float local_c8c;
  float local_c88;
  undefined8 local_c80;
  float *local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined4 local_c58;
  long local_c50;
  undefined4 local_c48;
  undefined4 local_c44;
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined8 local_c30;
  __m512 *local_c28;
  undefined8 local_c20;
  undefined8 local_c18;
  undefined8 local_c10;
  undefined4 local_c08;
  long local_c00;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  undefined4 local_be8;
  undefined8 local_be0;
  long local_bd8;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  int local_bc0;
  int local_bbc;
  __m512 *local_bb0;
  long *local_ba8;
  long *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  float *local_b88;
  float *local_b60;
  undefined8 *local_b50;
  undefined8 *local_b40;
  undefined1 local_b15;
  int local_b14;
  undefined8 *local_b08;
  undefined8 *local_ae0;
  undefined1 local_ad5;
  undefined4 local_ad4;
  float *local_ac8;
  undefined1 local_a9d;
  int local_a9c;
  undefined8 *local_a90;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined1 local_a40 [64];
  undefined4 local_9c4;
  undefined1 local_9c0 [64];
  undefined4 local_944;
  undefined1 local_940 [64];
  undefined4 local_8c4;
  undefined1 local_8c0 [64];
  undefined4 local_844;
  undefined1 local_840 [64];
  float local_7c4;
  undefined1 local_7c0 [64];
  float local_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  __m512 *local_268;
  long local_260;
  undefined4 local_254;
  long local_250;
  __m512 *local_248;
  undefined4 local_23c;
  int local_238;
  int local_234;
  undefined8 *local_230;
  float local_228 [3];
  float local_21c;
  long local_218;
  float *local_210;
  float local_204;
  float local_200;
  float local_1fc;
  __m512 *local_1f8;
  long local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  long local_1d8;
  undefined4 local_1cc;
  int local_1c8;
  int local_1c4;
  undefined8 *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  undefined4 local_194;
  long local_190;
  float *local_188;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  local_bbc = (int)in_RSI[7];
  local_bc0 = *(int *)((long)in_RSI + 0x2c);
  local_bc4 = (int)in_RSI[6];
  local_bc8 = local_bc0 * local_bc4;
  local_bb0 = in_RDX;
  local_ba8 = in_RSI;
  local_ba0 = in_RDI;
  for (local_bcc = 0; local_bcc < local_bbc; local_bcc = local_bcc + 1) {
    local_b08 = &local_c20;
    local_1c4 = *(int *)((long)local_ba0 + 0x2c);
    local_1c8 = (int)local_ba0[6];
    local_1cc = *(undefined4 *)((long)local_ba0 + 0x34);
    local_bd8 = *local_ba0 + local_ba0[8] * (long)local_bcc * local_ba0[2];
    local_1e0 = local_ba0[2];
    local_1e4 = (undefined4)local_ba0[3];
    local_1f0 = local_ba0[4];
    local_1c0 = &local_c20;
    local_1b0 = (long)local_1c4 * (long)local_1c8 * local_1e0;
    local_ae0 = &local_c20;
    local_b98 = &local_c20;
    local_a90 = &local_c70;
    local_234 = *(int *)((long)local_ba8 + 0x2c);
    local_238 = (int)local_ba8[6];
    local_23c = *(undefined4 *)((long)local_ba8 + 0x34);
    coeffs0 = (__m512 *)(*local_ba8 + local_ba8[8] * (long)local_bcc * local_ba8[2]);
    local_250 = local_ba8[2];
    local_254 = (undefined4)local_ba8[3];
    local_260 = local_ba8[4];
    local_230 = &local_c70;
    local_190 = (long)local_234 * (long)local_238 * local_250;
    local_a68 = &local_c70;
    local_b90 = &local_c70;
    local_ac8 = local_cc0;
    local_1fc = (*local_bb0)[0xb];
    local_200 = (*local_bb0)[0xc];
    local_204 = (*local_bb0)[0xd];
    tx = *(float **)*local_bb0;
    local_218 = *(long *)(*local_bb0 + 4);
    local_21c = (*local_bb0)[6];
    local_228._0_8_ = *(undefined8 *)(*local_bb0 + 8);
    coeffs2 = (__m512 *)local_cc0;
    local_1a0 = (long)(int)local_1fc * (long)(int)local_200 * local_218;
    local_188 = local_cc0;
    local_b88 = local_cc0;
    local_be8 = 0;
    local_bec = 0;
    local_bf0 = 0;
    local_bf4 = 0;
    local_c08 = 0;
    local_c10 = 0;
    local_c18 = 0;
    local_c20 = 0;
    local_c38 = 0;
    local_c3c = 0;
    local_c40 = 0;
    local_c44 = 0;
    local_c58 = 0;
    local_c60 = 0;
    local_c68 = 0;
    local_c70 = 0;
    local_194 = 0x10;
    local_1a4 = 0x10;
    local_1b4 = 0x10;
    local_a9c = local_bcc;
    local_a9d = 1;
    local_ad4 = 0;
    local_ad5 = 1;
    local_b14 = local_bcc;
    local_b15 = 1;
    local_be0 = 0;
    local_bf8 = 0;
    local_c30 = 0;
    local_c48 = 0;
    local_cc0[0] = 0.0;
    local_cc0[1] = 0.0;
    local_cc0[4] = 0.0;
    local_cc0[5] = 0.0;
    local_cc0[6] = 0.0;
    local_c98 = 0.0;
    local_c94 = 0.0;
    local_c90 = 0.0;
    local_c8c = 0.0;
    local_c88 = 0.0;
    local_c80 = 0;
    local_cc0[2] = 0.0;
    local_cc0[3] = 0.0;
    coeffs1 = local_bb0;
    local_c78 = tx;
    local_c28 = coeffs0;
    local_b60 = local_b88;
    local_b50 = local_b90;
    local_b40 = local_b98;
    local_248 = coeffs0;
    local_210 = tx;
    local_1f8 = coeffs2;
    local_1d8 = local_bd8;
    local_ca0 = (float  [2])local_228._0_8_;
    local_c50 = local_260;
    local_c00 = local_1f0;
    for (local_cd0 = 0; local_cd0 < local_bc8; local_cd0 = local_cd0 + 1) {
      local_744 = *local_c78;
      local_7c0 = vbroadcastss_avx512f(ZEXT416((uint)local_744));
      cubic_interp1d_p16(coeffs0,coeffs1,coeffs2,in_stack_ffffffffffffed98,(__m512 *)tx);
      local_7c4 = local_c78[1];
      local_840 = vbroadcastss_avx512f(ZEXT416((uint)local_7c4));
      cubic_interp1d_p16(coeffs0,coeffs1,coeffs2,in_stack_ffffffffffffed98,(__m512 *)tx);
      local_1088 = local_c78 + 2;
      for (local_108c = 0; local_108c < 4; local_108c = local_108c + 1) {
        if ((int)*local_1088 < 0) {
          local_844 = 0;
          local_8c0 = vbroadcastss_avx512f(ZEXT416(0));
          auVar20 = local_8c0;
          local_12c0 = local_8c0._0_8_;
          uStackY_12b8 = local_8c0._8_8_;
          uStackY_12b0 = local_8c0._16_8_;
          uStackY_12a8 = local_8c0._24_8_;
          uStackY_12a0 = local_8c0._32_8_;
          uStackY_1298 = local_8c0._40_8_;
          uStackY_1290 = local_8c0._48_8_;
          uStackY_1288 = local_8c0._56_8_;
          local_8c0 = auVar20;
        }
        else {
          local_a48 = (undefined8 *)(local_bd8 + (long)(int)*local_1088 * 4);
          local_12c0 = *local_a48;
          uStackY_12b8 = local_a48[1];
          uStackY_12b0 = local_a48[2];
          uStackY_12a8 = local_a48[3];
          uStackY_12a0 = local_a48[4];
          uStackY_1298 = local_a48[5];
          uStackY_1290 = local_a48[6];
          uStackY_1288 = local_a48[7];
        }
        if ((int)local_1088[1] < 0) {
          local_8c4 = 0;
          local_940 = vbroadcastss_avx512f(ZEXT416(0));
          auVar20 = local_940;
          local_1300 = local_940._0_8_;
          uStackY_12f8 = local_940._8_8_;
          uStackY_12f0 = local_940._16_8_;
          uStackY_12e8 = local_940._24_8_;
          uStackY_12e0 = local_940._32_8_;
          uStackY_12d8 = local_940._40_8_;
          uStackY_12d0 = local_940._48_8_;
          uStackY_12c8 = local_940._56_8_;
          local_940 = auVar20;
        }
        else {
          local_a50 = (undefined8 *)(local_bd8 + (long)(int)local_1088[1] * 4);
          local_1300 = *local_a50;
          uStackY_12f8 = local_a50[1];
          uStackY_12f0 = local_a50[2];
          uStackY_12e8 = local_a50[3];
          uStackY_12e0 = local_a50[4];
          uStackY_12d8 = local_a50[5];
          uStackY_12d0 = local_a50[6];
          uStackY_12c8 = local_a50[7];
        }
        if ((int)local_1088[2] < 0) {
          local_944 = 0;
          local_9c0 = vbroadcastss_avx512f(ZEXT416(0));
          auVar20 = local_9c0;
          local_1340 = local_9c0._0_8_;
          uStackY_1338 = local_9c0._8_8_;
          uStackY_1330 = local_9c0._16_8_;
          uStackY_1328 = local_9c0._24_8_;
          uStackY_1320 = local_9c0._32_8_;
          uStackY_1318 = local_9c0._40_8_;
          uStackY_1310 = local_9c0._48_8_;
          uStackY_1308 = local_9c0._56_8_;
          local_9c0 = auVar20;
        }
        else {
          local_a58 = (undefined8 *)(local_bd8 + (long)(int)local_1088[2] * 4);
          local_1340 = *local_a58;
          uStackY_1338 = local_a58[1];
          uStackY_1330 = local_a58[2];
          uStackY_1328 = local_a58[3];
          uStackY_1320 = local_a58[4];
          uStackY_1318 = local_a58[5];
          uStackY_1310 = local_a58[6];
          uStackY_1308 = local_a58[7];
        }
        if ((int)local_1088[3] < 0) {
          local_9c4 = 0;
          local_a40 = vbroadcastss_avx512f(ZEXT416(0));
          auVar20 = local_a40;
          local_1380 = local_a40._0_8_;
          uStackY_1378 = local_a40._8_8_;
          uStackY_1370 = local_a40._16_8_;
          uStackY_1368 = local_a40._24_8_;
          uStackY_1360 = local_a40._32_8_;
          uStackY_1358 = local_a40._40_8_;
          uStackY_1350 = local_a40._48_8_;
          uStackY_1348 = local_a40._56_8_;
          local_a40 = auVar20;
        }
        else {
          local_a60 = (undefined8 *)(local_bd8 + (long)(int)local_1088[3] * 4);
          local_1380 = *local_a60;
          uStackY_1378 = local_a60[1];
          uStackY_1370 = local_a60[2];
          uStackY_1368 = local_a60[3];
          uStackY_1360 = local_a60[4];
          uStackY_1358 = local_a60[5];
          uStackY_1350 = local_a60[6];
          uStackY_1348 = local_a60[7];
        }
        local_c0 = local_d40;
        uStack_b8 = uStack_d38;
        uStack_b0 = uStack_d30;
        uStack_a8 = uStack_d28;
        uStack_a0 = uStack_d20;
        uStack_98 = uStack_d18;
        uStack_90 = uStack_d10;
        uStack_88 = uStack_d08;
        local_100 = local_12c0;
        uStack_f8 = uStackY_12b8;
        uStack_f0 = uStackY_12b0;
        uStack_e8 = uStackY_12a8;
        uStack_e0 = uStackY_12a0;
        uStack_d8 = uStackY_1298;
        uStack_d0 = uStackY_1290;
        uStack_c8 = uStackY_1288;
        auVar18._8_8_ = uStack_d38;
        auVar18._0_8_ = local_d40;
        auVar18._16_8_ = uStack_d30;
        auVar18._24_8_ = uStack_d28;
        auVar18._32_8_ = uStack_d20;
        auVar18._40_8_ = uStack_d18;
        auVar18._48_8_ = uStack_d10;
        auVar18._56_8_ = uStack_d08;
        auVar17._8_8_ = uStackY_12b8;
        auVar17._0_8_ = local_12c0;
        auVar17._16_8_ = uStackY_12b0;
        auVar17._24_8_ = uStackY_12a8;
        auVar17._32_8_ = uStackY_12a0;
        auVar17._40_8_ = uStackY_1298;
        auVar17._48_8_ = uStackY_1290;
        auVar17._56_8_ = uStackY_1288;
        auVar20 = vmulps_avx512f(auVar18,auVar17);
        *(undefined1 (*) [64])(local_1000 + (long)local_108c * 8) = auVar20;
        lVar19 = (long)local_108c;
        local_300 = local_d80;
        uStack_2f8 = uStack_d78;
        uStack_2f0 = uStack_d70;
        uStack_2e8 = uStack_d68;
        uStack_2e0 = uStack_d60;
        uStack_2d8 = uStack_d58;
        uStack_2d0 = uStack_d50;
        uStack_2c8 = uStack_d48;
        local_340 = local_1300;
        uStack_338 = uStackY_12f8;
        uStack_330 = uStackY_12f0;
        uStack_328 = uStackY_12e8;
        uStack_320 = uStackY_12e0;
        uStack_318 = uStackY_12d8;
        uStack_310 = uStackY_12d0;
        uStack_308 = uStackY_12c8;
        local_380 = local_1000[lVar19 * 8];
        uStack_378 = local_1000[lVar19 * 8 + 1];
        uStack_370 = local_1000[lVar19 * 8 + 2];
        uStack_368 = local_1000[lVar19 * 8 + 3];
        uStack_360 = local_1000[lVar19 * 8 + 4];
        uStack_358 = local_1000[lVar19 * 8 + 5];
        uStack_350 = local_1000[lVar19 * 8 + 6];
        uStack_348 = local_1000[lVar19 * 8 + 7];
        auVar14._8_8_ = uStack_d78;
        auVar14._0_8_ = local_d80;
        auVar14._16_8_ = uStack_d70;
        auVar14._24_8_ = uStack_d68;
        auVar14._32_8_ = uStack_d60;
        auVar14._40_8_ = uStack_d58;
        auVar14._48_8_ = uStack_d50;
        auVar14._56_8_ = uStack_d48;
        auVar13._8_8_ = uStackY_12f8;
        auVar13._0_8_ = local_1300;
        auVar13._16_8_ = uStackY_12f0;
        auVar13._24_8_ = uStackY_12e8;
        auVar13._32_8_ = uStackY_12e0;
        auVar13._40_8_ = uStackY_12d8;
        auVar13._48_8_ = uStackY_12d0;
        auVar13._56_8_ = uStackY_12c8;
        auVar12._8_8_ = local_1000[lVar19 * 8 + 1];
        auVar12._0_8_ = local_1000[lVar19 * 8];
        auVar12._16_8_ = local_1000[lVar19 * 8 + 2];
        auVar12._24_8_ = local_1000[lVar19 * 8 + 3];
        auVar12._32_8_ = local_1000[lVar19 * 8 + 4];
        auVar12._40_8_ = local_1000[lVar19 * 8 + 5];
        auVar12._48_8_ = local_1000[lVar19 * 8 + 6];
        auVar12._56_8_ = local_1000[lVar19 * 8 + 7];
        auVar20 = vfmadd213ps_avx512f(auVar13,auVar14,auVar12);
        *(undefined1 (*) [64])(local_1000 + (long)local_108c * 8) = auVar20;
        lVar19 = (long)local_108c;
        local_3c0 = local_dc0;
        uStack_3b8 = uStack_db8;
        uStack_3b0 = uStack_db0;
        uStack_3a8 = uStack_da8;
        uStack_3a0 = uStack_da0;
        uStack_398 = uStack_d98;
        uStack_390 = uStack_d90;
        uStack_388 = uStack_d88;
        local_400 = local_1340;
        uStack_3f8 = uStackY_1338;
        uStack_3f0 = uStackY_1330;
        uStack_3e8 = uStackY_1328;
        uStack_3e0 = uStackY_1320;
        uStack_3d8 = uStackY_1318;
        uStack_3d0 = uStackY_1310;
        uStack_3c8 = uStackY_1308;
        local_440 = local_1000[lVar19 * 8];
        uStack_438 = local_1000[lVar19 * 8 + 1];
        uStack_430 = local_1000[lVar19 * 8 + 2];
        uStack_428 = local_1000[lVar19 * 8 + 3];
        uStack_420 = local_1000[lVar19 * 8 + 4];
        uStack_418 = local_1000[lVar19 * 8 + 5];
        uStack_410 = local_1000[lVar19 * 8 + 6];
        uStack_408 = local_1000[lVar19 * 8 + 7];
        auVar11._8_8_ = uStack_db8;
        auVar11._0_8_ = local_dc0;
        auVar11._16_8_ = uStack_db0;
        auVar11._24_8_ = uStack_da8;
        auVar11._32_8_ = uStack_da0;
        auVar11._40_8_ = uStack_d98;
        auVar11._48_8_ = uStack_d90;
        auVar11._56_8_ = uStack_d88;
        auVar10._8_8_ = uStackY_1338;
        auVar10._0_8_ = local_1340;
        auVar10._16_8_ = uStackY_1330;
        auVar10._24_8_ = uStackY_1328;
        auVar10._32_8_ = uStackY_1320;
        auVar10._40_8_ = uStackY_1318;
        auVar10._48_8_ = uStackY_1310;
        auVar10._56_8_ = uStackY_1308;
        auVar9._8_8_ = local_1000[lVar19 * 8 + 1];
        auVar9._0_8_ = local_1000[lVar19 * 8];
        auVar9._16_8_ = local_1000[lVar19 * 8 + 2];
        auVar9._24_8_ = local_1000[lVar19 * 8 + 3];
        auVar9._32_8_ = local_1000[lVar19 * 8 + 4];
        auVar9._40_8_ = local_1000[lVar19 * 8 + 5];
        auVar9._48_8_ = local_1000[lVar19 * 8 + 6];
        auVar9._56_8_ = local_1000[lVar19 * 8 + 7];
        auVar20 = vfmadd213ps_avx512f(auVar10,auVar11,auVar9);
        *(undefined1 (*) [64])(local_1000 + (long)local_108c * 8) = auVar20;
        lVar19 = (long)local_108c;
        local_480 = local_e00;
        uStack_478 = uStack_df8;
        uStack_470 = uStack_df0;
        uStack_468 = uStack_de8;
        uStack_460 = uStack_de0;
        uStack_458 = uStack_dd8;
        uStack_450 = uStack_dd0;
        uStack_448 = uStack_dc8;
        local_4c0 = local_1380;
        uStack_4b8 = uStackY_1378;
        uStack_4b0 = uStackY_1370;
        uStack_4a8 = uStackY_1368;
        uStack_4a0 = uStackY_1360;
        uStack_498 = uStackY_1358;
        uStack_490 = uStackY_1350;
        uStack_488 = uStackY_1348;
        local_500 = local_1000[lVar19 * 8];
        uStack_4f8 = local_1000[lVar19 * 8 + 1];
        uStack_4f0 = local_1000[lVar19 * 8 + 2];
        uStack_4e8 = local_1000[lVar19 * 8 + 3];
        uStack_4e0 = local_1000[lVar19 * 8 + 4];
        uStack_4d8 = local_1000[lVar19 * 8 + 5];
        uStack_4d0 = local_1000[lVar19 * 8 + 6];
        uStack_4c8 = local_1000[lVar19 * 8 + 7];
        auVar8._8_8_ = uStack_df8;
        auVar8._0_8_ = local_e00;
        auVar8._16_8_ = uStack_df0;
        auVar8._24_8_ = uStack_de8;
        auVar8._32_8_ = uStack_de0;
        auVar8._40_8_ = uStack_dd8;
        auVar8._48_8_ = uStack_dd0;
        auVar8._56_8_ = uStack_dc8;
        auVar7._8_8_ = uStackY_1378;
        auVar7._0_8_ = local_1380;
        auVar7._16_8_ = uStackY_1370;
        auVar7._24_8_ = uStackY_1368;
        auVar7._32_8_ = uStackY_1360;
        auVar7._40_8_ = uStackY_1358;
        auVar7._48_8_ = uStackY_1350;
        auVar7._56_8_ = uStackY_1348;
        auVar20._8_8_ = local_1000[lVar19 * 8 + 1];
        auVar20._0_8_ = local_1000[lVar19 * 8];
        auVar20._16_8_ = local_1000[lVar19 * 8 + 2];
        auVar20._24_8_ = local_1000[lVar19 * 8 + 3];
        auVar20._32_8_ = local_1000[lVar19 * 8 + 4];
        auVar20._40_8_ = local_1000[lVar19 * 8 + 5];
        auVar20._48_8_ = local_1000[lVar19 * 8 + 6];
        auVar20._56_8_ = local_1000[lVar19 * 8 + 7];
        auVar20 = vfmadd213ps_avx512f(auVar7,auVar8,auVar20);
        *(undefined1 (*) [64])(local_1000 + (long)local_108c * 8) = auVar20;
        local_1088 = local_1088 + 4;
      }
      auVar16._8_8_ = uStack_e38;
      auVar16._0_8_ = local_e40;
      auVar16._16_8_ = uStack_e30;
      auVar16._24_8_ = uStack_e28;
      auVar16._32_8_ = uStack_e20;
      auVar16._40_8_ = uStack_e18;
      auVar16._48_8_ = uStack_e10;
      auVar16._56_8_ = uStack_e08;
      auVar15._8_8_ = local_1000[1];
      auVar15._0_8_ = local_1000[0];
      auVar15._16_8_ = local_1000[2];
      auVar15._24_8_ = local_1000[3];
      auVar15._32_8_ = uStack_fe0;
      auVar15._40_8_ = uStack_fd8;
      auVar15._48_8_ = uStack_fd0;
      auVar15._56_8_ = uStack_fc8;
      auVar20 = vmulps_avx512f(auVar16,auVar15);
      local_1200 = auVar20._0_8_;
      local_5c0 = local_1200;
      uStack_11f8 = auVar20._8_8_;
      uStack_5b8 = uStack_11f8;
      uStack_11f0 = auVar20._16_8_;
      uStack_5b0 = uStack_11f0;
      uStack_11e8 = auVar20._24_8_;
      uStack_5a8 = uStack_11e8;
      uStack_11e0 = auVar20._32_8_;
      uStack_5a0 = uStack_11e0;
      uStack_11d8 = auVar20._40_8_;
      uStack_598 = uStack_11d8;
      uStack_11d0 = auVar20._48_8_;
      uStack_590 = uStack_11d0;
      uStack_11c8 = auVar20._56_8_;
      uStack_588 = uStack_11c8;
      auVar6._8_8_ = uStack_e78;
      auVar6._0_8_ = local_e80;
      auVar6._16_8_ = uStack_e70;
      auVar6._24_8_ = uStack_e68;
      auVar6._32_8_ = uStack_e60;
      auVar6._40_8_ = uStack_e58;
      auVar6._48_8_ = uStack_e50;
      auVar6._56_8_ = uStack_e48;
      auVar5._8_8_ = uStack_fb8;
      auVar5._0_8_ = local_fc0;
      auVar5._16_8_ = uStack_fb0;
      auVar5._24_8_ = uStack_fa8;
      auVar5._32_8_ = uStack_fa0;
      auVar5._40_8_ = uStack_f98;
      auVar5._48_8_ = uStack_f90;
      auVar5._56_8_ = uStack_f88;
      auVar20 = vfmadd213ps_avx512f(auVar5,auVar6,auVar20);
      local_1200 = auVar20._0_8_;
      local_680 = local_1200;
      uStack_11f8 = auVar20._8_8_;
      uStack_678 = uStack_11f8;
      uStack_11f0 = auVar20._16_8_;
      uStack_670 = uStack_11f0;
      uStack_11e8 = auVar20._24_8_;
      uStack_668 = uStack_11e8;
      uStack_11e0 = auVar20._32_8_;
      uStack_660 = uStack_11e0;
      uStack_11d8 = auVar20._40_8_;
      uStack_658 = uStack_11d8;
      uStack_11d0 = auVar20._48_8_;
      uStack_650 = uStack_11d0;
      uStack_11c8 = auVar20._56_8_;
      uStack_648 = uStack_11c8;
      auVar4._8_8_ = uStack_eb8;
      auVar4._0_8_ = local_ec0;
      auVar4._16_8_ = uStack_eb0;
      auVar4._24_8_ = uStack_ea8;
      auVar4._32_8_ = uStack_ea0;
      auVar4._40_8_ = uStack_e98;
      auVar4._48_8_ = uStack_e90;
      auVar4._56_8_ = uStack_e88;
      auVar3._8_8_ = uStack_f78;
      auVar3._0_8_ = local_f80;
      auVar3._16_8_ = uStack_f70;
      auVar3._24_8_ = uStack_f68;
      auVar3._32_8_ = uStack_f60;
      auVar3._40_8_ = uStack_f58;
      auVar3._48_8_ = uStack_f50;
      auVar3._56_8_ = uStack_f48;
      auVar20 = vfmadd213ps_avx512f(auVar3,auVar4,auVar20);
      local_1200 = auVar20._0_8_;
      local_740 = local_1200;
      uStack_11f8 = auVar20._8_8_;
      uStack_738 = uStack_11f8;
      uStack_11f0 = auVar20._16_8_;
      uStack_730 = uStack_11f0;
      uStack_11e8 = auVar20._24_8_;
      uStack_728 = uStack_11e8;
      uStack_11e0 = auVar20._32_8_;
      uStack_720 = uStack_11e0;
      uStack_11d8 = auVar20._40_8_;
      uStack_718 = uStack_11d8;
      uStack_11d0 = auVar20._48_8_;
      uStack_710 = uStack_11d0;
      uStack_11c8 = auVar20._56_8_;
      uStack_708 = uStack_11c8;
      auVar2._8_8_ = uStack_ef8;
      auVar2._0_8_ = local_f00;
      auVar2._16_8_ = uStack_ef0;
      auVar2._24_8_ = uStack_ee8;
      auVar2._32_8_ = uStack_ee0;
      auVar2._40_8_ = uStack_ed8;
      auVar2._48_8_ = uStack_ed0;
      auVar2._56_8_ = uStack_ec8;
      auVar1._8_8_ = uStack_f38;
      auVar1._0_8_ = local_f40;
      auVar1._16_8_ = uStack_f30;
      auVar1._24_8_ = uStack_f28;
      auVar1._32_8_ = uStack_f20;
      auVar1._40_8_ = uStack_f18;
      auVar1._48_8_ = uStack_f10;
      auVar1._56_8_ = uStack_f08;
      auVar20 = vfmadd213ps_avx512f(auVar1,auVar2,auVar20);
      local_268 = local_c28;
      local_1200 = auVar20._0_8_;
      local_2c0 = local_1200;
      uStack_11f8 = auVar20._8_8_;
      uStack_2b8 = uStack_11f8;
      uStack_11f0 = auVar20._16_8_;
      uStack_2b0 = uStack_11f0;
      uStack_11e8 = auVar20._24_8_;
      uStack_2a8 = uStack_11e8;
      uStack_11e0 = auVar20._32_8_;
      uStack_2a0 = uStack_11e0;
      uStack_11d8 = auVar20._40_8_;
      uStack_298 = uStack_11d8;
      uStack_11d0 = auVar20._48_8_;
      uStack_290 = uStack_11d0;
      uStack_11c8 = auVar20._56_8_;
      uStack_288 = uStack_11c8;
      *(undefined8 *)*local_c28 = local_1200;
      *(undefined8 *)(*local_c28 + 2) = uStack_11f8;
      *(undefined8 *)(*local_c28 + 4) = uStack_11f0;
      *(undefined8 *)(*local_c28 + 6) = uStack_11e8;
      *(undefined8 *)(*local_c28 + 8) = uStack_11e0;
      *(undefined8 *)(*local_c28 + 10) = uStack_11d8;
      *(undefined8 *)(*local_c28 + 0xc) = uStack_11d0;
      *(undefined8 *)(*local_c28 + 0xe) = uStack_11c8;
      local_c28 = local_c28 + 1;
      local_c78 = local_c78 + 0x12;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bicubic_apply_interpolation_p16(const Mat& src, Mat& dst, Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m512 x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3;
            __m512 y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3;
            __m512 value_f[4];
            cubic_interp1d_p16(x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3, _mm512_set1_ps(offset_value_ptr[0]));
            cubic_interp1d_p16(y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3, _mm512_set1_ps(offset_value_ptr[1]));

            const int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int ii = 0; ii < 4; ii++)
            {
                __m512 x0_val = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
                __m512 x1_val = offset_ptr[1] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[1]) : _mm512_set1_ps(0);
                __m512 x2_val = offset_ptr[2] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[2]) : _mm512_set1_ps(0);
                __m512 x3_val = offset_ptr[3] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[3]) : _mm512_set1_ps(0);

                value_f[ii] = _mm512_mul_ps(x_coeffs0, x0_val);
                value_f[ii] = _mm512_fmadd_ps(x_coeffs1, x1_val, value_f[ii]);
                value_f[ii] = _mm512_fmadd_ps(x_coeffs2, x2_val, value_f[ii]);
                value_f[ii] = _mm512_fmadd_ps(x_coeffs3, x3_val, value_f[ii]);

                offset_ptr += 4;
            }

            __m512 _v = _mm512_mul_ps(y_coeffs0, value_f[0]);
            _v = _mm512_fmadd_ps(y_coeffs1, value_f[1], _v);
            _v = _mm512_fmadd_ps(y_coeffs2, value_f[2], _v);
            _v = _mm512_fmadd_ps(y_coeffs3, value_f[3], _v);
            _mm512_storeu_ps(dstptr, _v);

            dstptr += 16;
            offset_value_ptr += 18;
        }
    }
}